

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O2

int order_features<feature_slice>(void *first,void *second)

{
  if (*(long *)((long)first + 8) == *(long *)((long)second + 8)) {
    return (uint)(*second <= *first && *first != *second) * 2 + -1;
  }
  return (int)*(long *)((long)first + 8) - (int)*(long *)((long)second + 8);
}

Assistant:

inline int order_features(const void* first, const void* second)
{
  if (((T*)first)->weight_index != ((T*)second)->weight_index)
    return (int)(((T*)first)->weight_index - ((T*)second)->weight_index);
  else if (((T*)first)->x > ((T*)second)->x)
    return 1;
  else
    return -1;
}